

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

BrotliDecoderErrorCode
ReadHuffmanCode(uint32_t alphabet_size_max,uint32_t alphabet_size_limit,HuffmanCode *table,
               uint32_t *opt_table_size,BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  uint16_t *count;
  uint8_t *code_lengths;
  short *psVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint *puVar6;
  size_t sVar7;
  byte *pbVar8;
  uint last;
  int iVar9;
  uint32_t uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint32_t uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  BrotliRunningHuffmanState BVar20;
  uint uVar21;
  uint16_t *puVar22;
  sbyte sVar23;
  uint32_t uVar24;
  BrotliRunningHuffmanState BVar25;
  uint32_t local_58;
  uint32_t local_54;
  
  br = &s->br;
  BVar20 = (s->arena).header.substate_huffman;
  count = (s->arena).header.code_length_histo;
  code_lengths = (s->arena).header.code_length_code_lengths;
  do {
    switch(BVar20) {
    case BROTLI_STATE_HUFFMAN_NONE:
      for (uVar24 = (s->br).bit_pos_ + 2; uVar24 - 0x41 < 2; uVar24 = uVar24 - 8) {
        sVar7 = (s->br).avail_in;
        if (sVar7 == 0) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar19 = (s->br).val_;
        pbVar8 = (s->br).next_in;
        (s->br).val_ = uVar19 >> 8;
        (s->br).val_ = (ulong)*pbVar8 << 0x38 | uVar19 >> 8;
        (s->br).bit_pos_ = uVar24 - 10;
        (s->br).avail_in = sVar7 - 1;
        (s->br).next_in = pbVar8 + 1;
      }
      uVar12 = (uint)((s->br).val_ >> ((char)uVar24 - 2U & 0x3f)) & 3;
      (s->arena).header.sub_loop_counter = uVar12;
      (s->br).bit_pos_ = uVar24;
      if (uVar12 == 1) goto LAB_0013a747;
      *(undefined8 *)((long)&s->arena + 0x1c) = 0x2000000000;
      *(undefined8 *)((long)&s->arena + 0x6de) = 0;
      *(undefined8 *)((long)&s->arena + 0x6e6) = 0;
      code_lengths[0] = '\0';
      code_lengths[1] = '\0';
      code_lengths[2] = '\0';
      code_lengths[3] = '\0';
      code_lengths[4] = '\0';
      code_lengths[5] = '\0';
      code_lengths[6] = '\0';
      code_lengths[7] = '\0';
      *(undefined8 *)((long)&s->arena + 0x6d8) = 0;
      (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
      BVar20 = BROTLI_STATE_HUFFMAN_COMPLEX;
      break;
    case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
      goto switchD_0013a52b_caseD_1;
    case BROTLI_STATE_HUFFMAN_SIMPLE_READ:
      goto switchD_0013a52b_caseD_2;
    case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD:
      uVar12 = (s->arena).header.symbol;
      goto LAB_0013a6df;
    case BROTLI_STATE_HUFFMAN_COMPLEX:
      local_58 = 8;
      uVar19 = (ulong)(s->arena).header.sub_loop_counter;
      uVar24 = (s->arena).header.repeat;
      uVar10 = (s->arena).header.space;
      goto LAB_0013a5f3;
    case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS:
      uVar12 = (s->arena).header.symbol;
      uVar24 = (s->arena).header.repeat;
      local_54 = (s->arena).header.space;
      uVar14 = (s->arena).header.repeat_code_len;
      local_58 = (s->arena).header.prev_code_len;
      puVar22 = (s->arena).header.symbol_lists;
      goto LAB_0013a95c;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
  } while( true );
LAB_0013a5f3:
  if (0x11 < uVar19) goto LAB_0013a8cc;
  bVar2 = "\x01\x02\x03\x04"[uVar19];
  uVar15 = (s->br).bit_pos_;
  while (uVar15 - 0x3d < 4) {
    sVar7 = (s->br).avail_in;
    if (sVar7 == 0) {
      if (uVar15 - 0x40 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = br->val_ >> ((byte)uVar15 & 0x3f);
      }
      bVar3 = "\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[uVar18];
      if ((uint)bVar3 <= -(uVar15 - 0x40)) goto LAB_0013a692;
      (s->arena).header.sub_loop_counter = (uint32_t)uVar19;
      (s->arena).header.repeat = uVar24;
      (s->arena).header.space = uVar10;
      BVar20 = BROTLI_STATE_HUFFMAN_COMPLEX;
      BVar25 = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
      goto LAB_0013ae05;
    }
    uVar18 = (s->br).val_;
    pbVar8 = (s->br).next_in;
    (s->br).val_ = uVar18 >> 8;
    (s->br).val_ = (ulong)*pbVar8 << 0x38 | uVar18 >> 8;
    uVar15 = uVar15 - 8;
    (s->br).bit_pos_ = uVar15;
    (s->br).avail_in = sVar7 - 1;
    (s->br).next_in = pbVar8 + 1;
  }
  uVar18 = (ulong)((uint)(br->val_ >> ((byte)uVar15 & 0x3f)) & 0xf);
  bVar3 = "\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[uVar18];
LAB_0013a692:
  bVar4 = ""[uVar18];
  (s->br).bit_pos_ = bVar3 + uVar15;
  *(byte *)((long)&s->arena + (ulong)bVar2 + 0x6d0) = bVar4;
  if ((0x1111UL >> (uVar18 & 0x3f) & 1) == 0) {
    count[bVar4] = count[bVar4] + 1;
    uVar10 = uVar10 - (0x20U >> (bVar4 & 0x1f));
    uVar24 = uVar24 + 1;
    if (uVar10 - 0x21 < 0xffffffe0) goto LAB_0013a8cc;
  }
  uVar19 = uVar19 + 1;
  goto LAB_0013a5f3;
LAB_0013a8cc:
  if ((uVar24 != 1) && (uVar10 != 0)) {
    return BROTLI_DECODER_ERROR_FORMAT_CL_SPACE;
  }
  BrotliBuildCodeLengthsHuffmanTable((s->arena).header.table,code_lengths,count);
  *(undefined8 *)((long)&s->arena + 0x6f2) = 0;
  *(undefined8 *)((long)&s->arena + 0x6fa) = 0;
  count[0] = 0;
  count[1] = 0;
  count[2] = 0;
  count[3] = 0;
  *(undefined8 *)((long)&s->arena + 0x6ea) = 0;
  puVar22 = (s->arena).header.symbol_lists;
  uVar12 = 0;
  for (lVar11 = -0x20; lVar11 != 0; lVar11 = lVar11 + 2) {
    *(uint *)((long)&s->arena + lVar11 * 2 + 0x690) = uVar12 | 0xfffffff0;
    *(undefined2 *)((long)puVar22 + lVar11) = 0xffff;
    uVar12 = uVar12 + 1;
  }
  *(undefined8 *)((long)&s->arena + 0x10) = 0x800000000;
  *(undefined8 *)((long)&s->arena + 0x18) = 0;
  (s->arena).header.space = 0x8000;
  (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
  local_54 = 0x8000;
  uVar14 = 0;
  uVar24 = 0;
  uVar12 = 0;
LAB_0013a95c:
  iVar9 = BrotliWarmupBitReader(br);
  if (iVar9 != 0) {
LAB_0013a97e:
    uVar19 = (ulong)uVar14;
LAB_0013a984:
    do {
      uVar14 = (uint)uVar19;
      do {
        uVar21 = uVar12;
        if ((alphabet_size_limit <= uVar21) || (local_54 == 0)) {
          (s->arena).header.space = local_54;
          goto LAB_0013ad80;
        }
        uVar19 = (s->br).avail_in;
        if (uVar19 < 4) {
          (s->arena).header.symbol = uVar21;
          (s->arena).header.repeat = uVar24;
          (s->arena).header.prev_code_len = local_58;
          (s->arena).header.repeat_code_len = uVar14;
          (s->arena).header.space = local_54;
          goto LAB_0013ab4e;
        }
        uVar12 = (s->br).bit_pos_;
        uVar18 = (s->br).val_;
        if (0x1f < uVar12) {
          uVar12 = uVar12 ^ 0x20;
          (s->br).bit_pos_ = uVar12;
          puVar6 = (uint *)(s->br).next_in;
          uVar18 = uVar18 >> 0x20 | (ulong)*puVar6 << 0x20;
          (s->br).val_ = uVar18;
          (s->br).avail_in = uVar19 - 4;
          (s->br).next_in = (uint8_t *)(puVar6 + 1);
        }
        uVar19 = (ulong)((uint)(uVar18 >> ((byte)uVar12 & 0x3f)) & 0x1f);
        uVar10 = (byte)s->trivial_literal_contexts[uVar19 + 0x11] + uVar12;
        (s->br).bit_pos_ = uVar10;
        uVar5 = *(ushort *)((long)s->trivial_literal_contexts + uVar19 * 4 + 0x46);
        uVar12 = (uint)uVar5;
        if (uVar5 < 0x10) {
          if (uVar5 != 0) {
            uVar19 = (ulong)uVar12;
            puVar22[*(int *)((long)&s->arena + uVar19 * 4 + 0x650)] = (uint16_t)uVar21;
            *(uint *)((long)&s->arena + uVar19 * 4 + 0x650) = uVar21;
            local_54 = local_54 - (0x8000U >> ((byte)uVar5 & 0x1f));
            psVar1 = (short *)((long)&s->arena + uVar19 * 2 + 0x6e2);
            *psVar1 = *psVar1 + 1;
            local_58 = uVar12;
          }
          uVar12 = uVar21 + 1;
          uVar24 = 0;
          goto LAB_0013a97e;
        }
        uVar15 = 0;
        uVar19 = 0;
        if (uVar12 == 0x10) {
          uVar19 = (ulong)local_58;
        }
        uVar12 = uVar12 == 0x10 ^ 3;
        uVar17 = (uint)(uVar18 >> ((byte)uVar10 & 0x3f)) & kBitMask[uVar12];
        (s->br).bit_pos_ = uVar10 + uVar12;
        if (uVar14 == (uint)uVar19) {
          if (uVar24 == 0) {
            uVar19 = (ulong)uVar14;
            goto LAB_0013aa47;
          }
          iVar9 = uVar24 - 2 << (sbyte)uVar12;
          uVar19 = (ulong)uVar14;
          uVar15 = uVar24;
        }
        else {
LAB_0013aa47:
          iVar9 = 0;
        }
        uVar24 = uVar17 + iVar9 + 3;
        iVar13 = uVar24 - uVar15;
        uVar12 = iVar13 + uVar21;
        if (alphabet_size_limit < uVar12) {
          local_54 = 0xfffff;
          uVar12 = alphabet_size_limit;
          goto LAB_0013a984;
        }
        uVar14 = 0;
      } while ((int)uVar19 == 0);
      iVar9 = ((iVar9 + uVar17) - uVar15) + 3;
      uVar14 = *(uint *)((long)&s->arena + uVar19 * 4 + 0x650);
      do {
        uVar17 = uVar21;
        puVar22[(int)uVar14] = (uint16_t)uVar17;
        iVar9 = iVar9 + -1;
        uVar14 = uVar17;
        uVar21 = uVar17 + 1;
      } while (iVar9 != 0);
      *(uint *)((long)&s->arena + uVar19 * 4 + 0x650) = uVar17;
      local_54 = local_54 - (iVar13 << (0xfU - (char)uVar19 & 0x1f));
      psVar1 = (short *)((long)&s->arena + uVar19 * 2 + 0x6e2);
      *psVar1 = *psVar1 + (short)iVar13;
    } while( true );
  }
  uVar21 = (s->arena).header.symbol;
LAB_0013ab4e:
  local_54 = (s->arena).header.space;
LAB_0013ab62:
  do {
    sVar23 = 3;
    uVar19 = 1;
    do {
      do {
        if (alphabet_size_limit <= uVar21) goto LAB_0013ad80;
        if (local_54 == 0) goto LAB_0013ad8d;
        if (uVar19 == 0) {
          sVar7 = (s->br).avail_in;
          if (sVar7 == 0) {
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          uVar19 = (s->br).val_;
          (s->br).val_ = uVar19 >> 8;
          pbVar8 = (s->br).next_in;
          (s->br).val_ = (ulong)*pbVar8 << 0x38 | uVar19 >> 8;
          uVar24 = (s->br).bit_pos_ - 8;
          (s->br).bit_pos_ = uVar24;
          (s->br).avail_in = sVar7 - 1;
          (s->br).next_in = pbVar8 + 1;
        }
        else {
          uVar24 = (s->br).bit_pos_;
        }
        uVar12 = 0;
        if (uVar24 - 0x40 != 0) {
          uVar12 = (uint)(br->val_ >> ((byte)uVar24 & 0x3f));
        }
        uVar14 = -(uVar24 - 0x40);
        bVar2 = (byte)s->trivial_literal_contexts[(ulong)(uVar12 & 0x1f) + 0x11];
        uVar19 = 0;
      } while (uVar14 < bVar2);
      uVar5 = *(ushort *)((long)s->trivial_literal_contexts + (ulong)(uVar12 & 0x1f) * 4 + 0x46);
      uVar19 = (ulong)uVar5;
      if (uVar5 < 0x10) {
        (s->br).bit_pos_ = uVar24 + bVar2;
        (s->arena).header.repeat = 0;
        if (uVar19 != 0) {
          (s->arena).header.symbol_lists[*(int *)((long)&s->arena + uVar19 * 4 + 0x650)] =
               (uint16_t)uVar21;
          *(uint *)((long)&s->arena + uVar19 * 4 + 0x650) = uVar21;
          (s->arena).header.prev_code_len = (uint)uVar5;
          local_54 = local_54 - (0x8000U >> ((byte)uVar5 & 0x1f));
          (s->arena).header.space = local_54;
          psVar1 = (short *)((long)&s->arena + uVar19 * 2 + 0x6e2);
          *psVar1 = *psVar1 + 1;
        }
        uVar21 = uVar21 + 1;
        (s->arena).header.symbol = uVar21;
        goto LAB_0013ab62;
      }
      uVar17 = ((uint)uVar5 + (uint)bVar2) - 0xe;
      uVar19 = 0;
    } while (uVar14 < uVar17);
    uVar12 = uVar12 >> (bVar2 & 0x1f) & kBitMask[uVar5 - 0xe];
    (s->br).bit_pos_ = uVar17 + uVar24;
    if (uVar5 == 0x10) {
      uVar19 = (ulong)(s->arena).header.prev_code_len;
      sVar23 = 2;
    }
    uVar24 = (uint32_t)uVar19;
    if ((s->arena).header.repeat_code_len == uVar24) {
      uVar10 = (s->arena).header.repeat;
      if (uVar10 == 0) goto LAB_0013acc1;
      iVar9 = uVar10 - 2 << sVar23;
    }
    else {
      (s->arena).header.repeat_code_len = uVar24;
LAB_0013acc1:
      iVar9 = 0;
      uVar10 = 0;
    }
    puVar22 = (s->arena).header.symbol_lists;
    uVar15 = uVar12 + iVar9 + 3;
    (s->arena).header.repeat = uVar15;
    iVar13 = uVar15 - uVar10;
    uVar14 = iVar13 + uVar21;
    if (alphabet_size_limit < uVar14) {
      (s->arena).header.symbol = alphabet_size_limit;
      (s->arena).header.space = 0xfffff;
      local_54 = 0xfffff;
      uVar21 = alphabet_size_limit;
    }
    else if (uVar24 == 0) {
      (s->arena).header.symbol = uVar14;
      uVar21 = uVar14;
    }
    else {
      iVar9 = ((iVar9 + uVar12) - uVar10) + 3;
      uVar12 = *(uint *)((long)&s->arena + uVar19 * 4 + 0x650);
      do {
        uVar17 = uVar21;
        puVar22[(int)uVar12] = (uint16_t)uVar17;
        iVar9 = iVar9 + -1;
        uVar12 = uVar17;
        uVar21 = uVar17 + 1;
      } while (iVar9 != 0);
      (s->arena).header.symbol = uVar14;
      *(uint *)((long)&s->arena + uVar19 * 4 + 0x650) = uVar17;
      local_54 = local_54 - (iVar13 << (0xfU - (char)uVar19 & 0x1f));
      (s->arena).header.space = local_54;
      psVar1 = (short *)((long)&s->arena + uVar19 * 2 + 0x6e2);
      *psVar1 = *psVar1 + (short)iVar13;
      uVar21 = uVar14;
    }
  } while( true );
LAB_0013ad80:
  if (local_54 != 0) {
    return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
  }
LAB_0013ad8d:
  uVar24 = BrotliBuildHuffmanTable(table,8,(s->arena).header.symbol_lists,count);
  goto LAB_0013addb;
LAB_0013a7db:
  BVar25 = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
  goto LAB_0013ae05;
switchD_0013a52b_caseD_1:
  uVar24 = (s->br).bit_pos_;
LAB_0013a747:
  BVar20 = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
  for (uVar24 = uVar24 + 2; uVar24 - 0x41 < 2; uVar24 = uVar24 - 8) {
    sVar7 = (s->br).avail_in;
    if (sVar7 == 0) goto LAB_0013a7db;
    uVar19 = (s->br).val_;
    pbVar8 = (s->br).next_in;
    (s->br).val_ = uVar19 >> 8;
    (s->br).val_ = (ulong)*pbVar8 << 0x38 | uVar19 >> 8;
    (s->br).bit_pos_ = uVar24 - 10;
    (s->br).avail_in = sVar7 - 1;
    (s->br).next_in = pbVar8 + 1;
  }
  (s->arena).header.symbol = (uint)((s->br).val_ >> ((char)uVar24 - 2U & 0x3f)) & 3;
  (s->br).bit_pos_ = uVar24;
  (s->arena).header.sub_loop_counter = 0;
switchD_0013a52b_caseD_2:
  uVar14 = 0;
  for (uVar12 = alphabet_size_max - 1; uVar12 != 0; uVar12 = uVar12 >> 1) {
    uVar14 = uVar14 + 1;
  }
  uVar12 = (s->arena).header.symbol;
  for (uVar21 = (s->arena).header.sub_loop_counter; uVar21 <= uVar12; uVar21 = uVar21 + 1) {
    uVar24 = (s->br).bit_pos_;
    for (iVar9 = -uVar24; uVar24 = uVar24 - 8, iVar9 + 0x40U < uVar14; iVar9 = iVar9 + 8) {
      sVar7 = (s->br).avail_in;
      if (sVar7 == 0) {
        (s->arena).header.sub_loop_counter = uVar21;
        BVar20 = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
        BVar25 = BVar20;
        goto LAB_0013ae05;
      }
      uVar19 = (s->br).val_;
      pbVar8 = (s->br).next_in;
      (s->br).val_ = uVar19 >> 8;
      (s->br).val_ = (ulong)*pbVar8 << 0x38 | uVar19 >> 8;
      (s->br).bit_pos_ = uVar24;
      (s->br).avail_in = sVar7 - 1;
      (s->br).next_in = pbVar8 + 1;
    }
    uVar17 = (uint)((s->br).val_ >> (-(char)iVar9 & 0x3fU)) & kBitMask[uVar14];
    (s->br).bit_pos_ = uVar14 - iVar9;
    if (alphabet_size_limit <= uVar17) {
      return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET;
    }
    *(short *)((long)&s->arena + (ulong)uVar21 * 2 + 0xb0) = (short)uVar17;
  }
  uVar19 = 0;
  while (uVar18 = uVar19, uVar18 != uVar12) {
    uVar16 = uVar18 + 1 & 0xffffffff;
    while (uVar19 = uVar18 + 1, (uint)uVar16 <= uVar12) {
      lVar11 = uVar16 * 2;
      uVar16 = (ulong)((uint)uVar16 + 1);
      if (*(short *)((long)&s->arena + uVar18 * 2 + 0xb0) ==
          *(short *)((long)&s->arena + lVar11 + 0xb0)) {
        return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME;
      }
    }
  }
LAB_0013a6df:
  if (uVar12 == 3) {
    BVar20 = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
    uVar19 = (ulong)(s->br).bit_pos_;
    while ((int)uVar19 == 0x40) {
      sVar7 = (s->br).avail_in;
      if (sVar7 == 0) goto LAB_0013a7db;
      uVar19 = (s->br).val_;
      pbVar8 = (s->br).next_in;
      (s->br).val_ = uVar19 >> 8;
      (s->br).val_ = (ulong)*pbVar8 << 0x38 | uVar19 >> 8;
      (s->br).bit_pos_ = 0x38;
      (s->br).avail_in = sVar7 - 1;
      (s->br).next_in = pbVar8 + 1;
      uVar19 = 0x38;
    }
    (s->br).bit_pos_ = (int)uVar19 + 1;
    uVar12 = (((s->br).val_ >> (uVar19 & 0x3f) & 1) != 0) + 3;
    (s->arena).header.symbol = uVar12;
  }
  uVar24 = BrotliBuildSimpleHuffmanTable(table,8,(s->arena).header.symbols_lists_array,uVar12);
LAB_0013addb:
  BVar20 = BROTLI_STATE_HUFFMAN_NONE;
  BVar25 = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
  if (opt_table_size != (uint32_t *)0x0) {
    *opt_table_size = uVar24;
  }
LAB_0013ae05:
  (s->arena).header.substate_huffman = BVar20;
  return BVar25;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(uint32_t alphabet_size_max,
                                              uint32_t alphabet_size_limit,
                                              HuffmanCode* table,
                                              uint32_t* opt_table_size,
                                              BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliMetablockHeaderArena* h = &s->arena.header;
  /* State machine. */
  for (;;) {
    switch (h->substate_huffman) {
      case BROTLI_STATE_HUFFMAN_NONE:
        if (!BrotliSafeReadBits(br, 2, &h->sub_loop_counter)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        BROTLI_LOG_UINT(h->sub_loop_counter);
        /* The value is used as follows:
           1 for simple code;
           0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
        if (h->sub_loop_counter != 1) {
          h->space = 32;
          h->repeat = 0;  /* num_codes */
          memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo[0]) *
              (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
          memset(&h->code_length_code_lengths[0], 0,
              sizeof(h->code_length_code_lengths));
          h->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
          continue;
        }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
        /* Read symbols, codes & code lengths directly. */
        if (!BrotliSafeReadBits(br, 2, &h->symbol)) {  /* num_symbols */
          h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        h->sub_loop_counter = 0;
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
        BrotliDecoderErrorCode result =
            ReadSimpleHuffmanSymbols(alphabet_size_max, alphabet_size_limit, s);
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }
      }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
        uint32_t table_size;
        if (h->symbol == 3) {
          uint32_t bits;
          if (!BrotliSafeReadBits(br, 1, &bits)) {
            h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          h->symbol += bits;
        }
        BROTLI_LOG_UINT(h->symbol);
        table_size = BrotliBuildSimpleHuffmanTable(
            table, HUFFMAN_TABLE_BITS, h->symbols_lists_array, h->symbol);
        if (opt_table_size) {
          *opt_table_size = table_size;
        }
        h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
        return BROTLI_DECODER_SUCCESS;
      }

      /* Decode Huffman-coded code lengths. */
      case BROTLI_STATE_HUFFMAN_COMPLEX: {
        uint32_t i;
        BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }
        BrotliBuildCodeLengthsHuffmanTable(h->table,
                                           h->code_length_code_lengths,
                                           h->code_length_histo);
        memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo));
        for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
          h->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
          h->symbol_lists[h->next_symbol[i]] = 0xFFFF;
        }

        h->symbol = 0;
        h->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
        h->repeat = 0;
        h->repeat_code_len = 0;
        h->space = 32768;
        h->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
      }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
        uint32_t table_size;
        BrotliDecoderErrorCode result = ReadSymbolCodeLengths(
            alphabet_size_limit, s);
        if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
          result = SafeReadSymbolCodeLengths(alphabet_size_limit, s);
        }
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }

        if (h->space != 0) {
          BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", (int)h->space));
          return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
        }
        table_size = BrotliBuildHuffmanTable(
            table, HUFFMAN_TABLE_BITS, h->symbol_lists, h->code_length_histo);
        if (opt_table_size) {
          *opt_table_size = table_size;
        }
        h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
        return BROTLI_DECODER_SUCCESS;
      }

      default:
        return
            BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
    }
  }
}